

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioVoice_SetVolume(FAudioVoice *voice,float Volume,uint32_t OperationSet)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  SDL_AssertState sdl_assert_state;
  float local_1c;
  float local_18;
  
  do {
    if (in_ESI == 0) goto LAB_0012452f;
    iVar2 = SDL_ReportAssertion(&FAudioVoice_SetVolume::sdl_assert_data,"FAudioVoice_SetVolume",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/GloriousEggroll[P]FAudio/src/FAudio.c"
                                ,0x651);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_0012452f:
  if (in_XMM0_Da <= 16777216.0) {
    local_1c = in_XMM0_Da;
    if (in_XMM0_Da < -16777216.0) {
      local_1c = -16777216.0;
    }
    local_18 = local_1c;
  }
  else {
    local_18 = 16777216.0;
  }
  *(float *)(in_RDI + 0xa0) = local_18;
  return 0;
}

Assistant:

uint32_t FAudioVoice_SetVolume(
	FAudioVoice *voice,
	float Volume,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)
	FAudio_assert(OperationSet == FAUDIO_COMMIT_NOW);

	voice->volume = FAudio_clamp(
		Volume,
		-FAUDIO_MAX_VOLUME_LEVEL,
		FAUDIO_MAX_VOLUME_LEVEL
	);
	LOG_API_EXIT(voice->audio)
	return 0;
}